

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O0

uint __thiscall
GeneralHash<1,unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (GeneralHash<1,unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  size_type sVar1;
  byte *pbVar2;
  uint local_20;
  uint local_1c;
  uint k;
  uint answer;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *c_local;
  GeneralHash<1,_unsigned_int,_unsigned_char> *this_local;
  
  local_1c = 0;
  local_20 = 0;
  _k = c;
  c_local = (deque<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  while( true ) {
    sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(_k);
    if (sVar1 <= local_20) break;
    GeneralHash<1,_unsigned_int,_unsigned_char>::fastleftshift
              ((GeneralHash<1,_unsigned_int,_unsigned_char> *)this,&local_1c,1);
    pbVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (_k,(ulong)local_20);
    local_1c = *(uint *)(this + (ulong)*pbVar2 * 4 + 0x10) ^ local_1c;
    local_20 = local_20 + 1;
  }
  return local_1c;
}

Assistant:

hashvaluetype hash(container &c) const {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift(answer, 1);
      answer ^= hasher.hashvalues[c[k]];
    }
    return answer;
  }